

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGetTextureSubImageTests.cpp
# Opt level: O2

bool __thiscall gl4cts::GetTextureSubImage::Errors::testNegativeOffsetError(Errors *this)

{
  ostringstream *poVar1;
  int iVar2;
  int value;
  undefined4 extraout_var;
  char *pcVar3;
  undefined1 local_1a8 [384];
  
  iVar2 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  (*this->m_gl_GetTextureSubImage)
            (this->m_texture_2D,0,-1,0,0,2,2,1,0x1908,0x1401,0x10,this->m_destination_buffer);
  value = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  if (value != 0x501) {
    local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "GL_INVALID_VALUE error is expected to be generated by glGetTextureSubImage if xoffset, yoffset or zoffset are negative (OpenGL 4.5 Core Specification chapter 8.11.4)."
                   );
    std::operator<<((ostream *)poVar1," However, the error value ");
    pcVar3 = glu::getErrorName(value);
    std::operator<<((ostream *)poVar1,pcVar3);
    std::operator<<((ostream *)poVar1," was generated.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  (*this->m_gl_GetCompressedTextureSubImage)
            (this->m_texture_2D_compressed,0,-1,0,0,4,4,1,0x10,this->m_destination_buffer);
  iVar2 = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  if (iVar2 != 0x501) {
    local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "GL_INVALID_VALUE error is expected to be generated by glGetCompressedTextureSubImage if xoffset, yoffset or zoffset are negative (OpenGL 4.5 Core Specification chapter 8.11.4)."
                   );
    std::operator<<((ostream *)poVar1," However, the error value ");
    pcVar3 = glu::getErrorName(iVar2);
    std::operator<<((ostream *)poVar1,pcVar3);
    std::operator<<((ostream *)poVar1," was generated.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  return value == 0x501 && iVar2 == 0x501;
}

Assistant:

bool gl4cts::GetTextureSubImage::Errors::testNegativeOffsetError()
{
	/* OpenGL functions access point. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Test. */
	m_gl_GetTextureSubImage(m_texture_2D, 0, -1, 0, 0, s_texture_data_width, s_texture_data_height, 1, GL_RGBA,
							GL_UNSIGNED_BYTE, s_destination_buffer_size, m_destination_buffer);

	glw::GLint error_value	 = gl.getError();
	glw::GLint is_proper_error = (GL_INVALID_VALUE == error_value);

	if (!is_proper_error)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "GL_INVALID_VALUE error is expected to be generated by glGetTextureSubImage if xoffset, "
							  "yoffset or zoffset are negative (OpenGL 4.5 Core Specification chapter 8.11.4)."
						   << " However, the error value " << glu::getErrorName(error_value) << " was generated."
						   << tcu::TestLog::EndMessage;
	}

	m_gl_GetCompressedTextureSubImage(m_texture_2D_compressed, 0, -1, 0, 0, s_texture_data_compressed_width,
									  s_texture_data_compressed_height, 1, s_destination_buffer_size,
									  m_destination_buffer);

	error_value = gl.getError();

	glw::GLint is_proper_error_compressed = (GL_INVALID_VALUE == error_value);

	if (!is_proper_error_compressed)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "GL_INVALID_VALUE error is expected to be generated by glGetCompressedTextureSubImage if "
							  "xoffset, yoffset or zoffset are negative (OpenGL 4.5 Core Specification chapter 8.11.4)."
						   << " However, the error value " << glu::getErrorName(error_value) << " was generated."
						   << tcu::TestLog::EndMessage;
	}

	if (is_proper_error && is_proper_error_compressed)
	{
		return true;
	}

	return false;
}